

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_softsynth_mididevice.cpp
# Opt level: O3

int __thiscall SoftSynthMIDIDevice::Resume(SoftSynthMIDIDevice *this)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0;
  if (this->Started == false) {
    iVar2 = 1;
    iVar1 = (*this->Stream->_vptr_SoundStream[2])(0x3f800000,this->Stream,1);
    if ((char)iVar1 != '\0') {
      this->Started = true;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int SoftSynthMIDIDevice::Resume()
{
	if (!Started)
	{
		if (Stream->Play(true, 1))
		{
			Started = true;
			return 0;
		}
		return 1;
	}
	return 0;
}